

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

bool el::base::utils::File::pathExists(char *path,bool considerFile)

{
  int iVar1;
  byte in_SIL;
  char *in_RDI;
  stat st;
  stat sStack_a8;
  byte local_11;
  bool local_1;
  
  local_11 = in_SIL & 1;
  if (in_RDI == (char *)0x0) {
    local_1 = false;
  }
  else {
    iVar1 = stat(in_RDI,&sStack_a8);
    local_1 = iVar1 == 0;
  }
  return local_1;
}

Assistant:

bool File::pathExists(const char* path, bool considerFile) {
  if (path == nullptr) {
    return false;
  }
#if ELPP_OS_UNIX
  ELPP_UNUSED(considerFile);
  struct stat st;
  return (stat(path, &st) == 0);
#elif ELPP_OS_WINDOWS
  DWORD fileType = GetFileAttributesA(path);
  if (fileType == INVALID_FILE_ATTRIBUTES) {
    return false;
  }
  return considerFile ? true : ((fileType & FILE_ATTRIBUTE_DIRECTORY) == 0 ? false : true);
#endif  // ELPP_OS_UNIX
}